

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O1

void __thiscall wasm::GlobalTypeRewriter::mapTypes(GlobalTypeRewriter *this,TypeMap *oldToNewTypes)

{
  Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_> *this_00;
  Function *pFVar1;
  pointer pTVar2;
  pointer puVar3;
  Global *pGVar4;
  ElementSegment *pEVar5;
  pointer ppEVar6;
  long *plVar7;
  pointer puVar8;
  pointer puVar9;
  pointer puVar10;
  Tag *pTVar11;
  const_iterator cVar12;
  Expression *pEVar13;
  Type TVar14;
  Type TVar15;
  key_type *pkVar16;
  Type *var;
  pointer pTVar17;
  long *plVar18;
  pointer puVar19;
  pointer puVar20;
  pointer puVar21;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_1;
  pointer puVar22;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar23;
  pointer ppEVar24;
  PassRunner local_278;
  undefined **local_160;
  CodeUpdater updater;
  key_type local_40;
  pointer local_38;
  
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_Pass.runner =
       (PassRunner *)
       &updater.
        super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
        .super_Pass.name._M_string_length;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_Pass._vptr_Pass = (_func_int **)0x0;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_Pass.name._M_dataplus._M_p = (pointer)0x0;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_Pass.name._M_string_length._0_1_ = 0;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_Pass.name.field_2._8_8_ = 0;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
  super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.replacep =
       (Expression **)0x0;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
  super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.stack.fixed._M_elems
  [9].currp = (Expression **)0x0;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
  super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::Task,_std::allocator<wasm::Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
  super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::Task,_std::allocator<wasm::Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
  super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::Task,_std::allocator<wasm::Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
  super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.currFunction =
       (Function *)0x0;
  local_160 = &PTR__WalkerPass_00d8c288;
  local_278.wasm = this->wasm;
  local_278.options.arguments._M_h._M_buckets = &local_278.options.arguments._M_h._M_single_bucket;
  local_278._vptr_PassRunner = (_func_int **)&PTR__PassRunner_00d875f8;
  local_278.allocator = &(local_278.wasm)->allocator;
  local_278.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_278.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_278.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_278._41_8_ = 0;
  local_278.options.validate = true;
  local_278.options.validateGlobally = true;
  local_278.options.optimizeLevel = 0;
  local_278.options.shrinkLevel = 0;
  local_278.options.inlining.alwaysInlineMaxSize = 2;
  local_278.options.inlining.oneCallerInlineMaxSize = 0xffffffff;
  local_278.options.inlining.flexibleInlineMaxSize = 0x14;
  local_278.options.inlining.allowFunctionsWithLoops = false;
  local_278.options.inlining.partialInliningIfs = 0;
  local_278.options.ignoreImplicitTraps = false;
  local_278.options.trapsNeverHappen = false;
  local_278.options.lowMemoryUnused = false;
  local_278.options.fastMath = false;
  local_278.options.zeroFilledMemory = false;
  local_278.options.closedWorld = false;
  local_278.options.debugInfo = false;
  local_278.options.targetJS = false;
  local_278.options.arguments._M_h._M_bucket_count = 1;
  local_278.options.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_278.options.arguments._M_h._M_element_count = 0;
  local_278.options.arguments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_278.options.arguments._M_h._M_rehash_policy._M_next_resize = 0;
  local_278.options.arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_278.options.passesToSkip._M_h._M_buckets =
       &local_278.options.passesToSkip._M_h._M_single_bucket;
  local_278.options.passesToSkip._M_h._M_bucket_count = 1;
  local_278.options.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_278.options.passesToSkip._M_h._M_element_count = 0;
  local_278.options.passesToSkip._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_278.skippedPasses._M_h._M_buckets = &local_278.skippedPasses._M_h._M_single_bucket;
  local_278.options.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_278.options.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_7_ = 0;
  local_278._215_4_ = 0;
  local_278.options.passesToSkip._M_h._M_rehash_policy._M_next_resize = 0;
  local_278.options.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_278.skippedPasses._M_h._M_bucket_count = 1;
  local_278.skippedPasses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_278.skippedPasses._M_h._M_element_count = 0;
  local_278.skippedPasses._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_278.skippedPasses._M_h._M_rehash_policy._M_next_resize = 0;
  local_278.skippedPasses._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar23 = ((local_278.wasm)->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (pointer)((local_278.wasm)->functions).
                      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
  super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.currModule =
       (Module *)oldToNewTypes;
  if ((pointer)puVar23 != local_38) {
    do {
      pEVar13 = (Expression *)
                (((puVar23->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->type).id;
      local_40.id = (uintptr_t)pEVar13;
      if ((Expression *)0xd < pEVar13) {
        cVar12 = std::
                 _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)updater.
                           super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
                           .
                           super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>
                           .
                           super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>
                           .currModule,&local_40);
        pkVar16 = (key_type *)
                  ((long)cVar12.
                         super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                         ._M_cur + 0x10);
        if (cVar12.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>.
            _M_cur == (__node_type *)0x0) {
          pkVar16 = &local_40;
        }
        pEVar13 = (Expression *)pkVar16->id;
      }
      pFVar1 = (puVar23->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      (pFVar1->type).id = (uintptr_t)pEVar13;
      pTVar2 = *(pointer *)
                ((long)&(pFVar1->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_> +
                8);
      for (pTVar17 = *(pointer *)
                      &(pFVar1->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                       _M_impl; pTVar17 != pTVar2; pTVar17 = pTVar17 + 1) {
        TVar14 = mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::
                 HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::
                 HeapType_const,wasm::HeapType>>>const&)::CodeUpdater::getNew(wasm::Type_
                           (&local_160,pTVar17->id);
        pTVar17->id = TVar14.id;
      }
      puVar23 = puVar23 + 1;
    } while ((pointer)puVar23 != local_38);
  }
  if ((PassRunner *)
      updater.
      super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
      .super_Pass._vptr_Pass != &local_278 &&
      updater.
      super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
      .super_Pass._vptr_Pass != (_func_int **)0x0) {
    __assert_fail("(!runner || runner == runner_) && \"Pass already had a runner\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/pass.h"
                  ,0x1dc,"void wasm::Pass::setPassRunner(PassRunner *)");
  }
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_Pass._vptr_Pass = (_func_int **)&local_278;
  (*(code *)local_160[2])(&local_160,this->wasm);
  this_00 = (Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_> *)
            (&updater.
              super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
              .super_Pass.name.field_2._M_allocated_capacity + 1);
  updater.oldToNewTypes = (TypeMap *)this->wasm;
  puVar3 = (((Module *)updater.oldToNewTypes)->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
  super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.currFunction =
       (Function *)updater.oldToNewTypes;
  for (puVar21 = (((Module *)updater.oldToNewTypes)->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar3; puVar21 = puVar21 + 1
      ) {
    pGVar4 = (puVar21->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (*(char **)((long)&(pGVar4->super_Importable).module + 8) == (char *)0x0) {
      Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::walk
                (this_00,&pGVar4->init);
    }
  }
  puVar20 = (((Module *)updater.oldToNewTypes)->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (((Module *)updater.oldToNewTypes)->elementSegments).
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar20 != local_38) {
    do {
      pEVar5 = (puVar20->_M_t).
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (pEVar5->offset != (Expression *)0x0) {
        Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::walk
                  (this_00,&pEVar5->offset);
      }
      pEVar5 = (puVar20->_M_t).
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      ppEVar6 = *(pointer *)
                 ((long)&(pEVar5->data).
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                 + 8);
      for (ppEVar24 = *(pointer *)
                       &(pEVar5->data).
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl; ppEVar24 != ppEVar6; ppEVar24 = ppEVar24 + 1) {
        local_40.id = (uintptr_t)*ppEVar24;
        Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::walk
                  (this_00,(Expression **)&local_40);
      }
      puVar20 = puVar20 + 1;
    } while (puVar20 != local_38);
  }
  plVar7 = (long *)updater.oldToNewTypes[2]._M_h._M_rehash_policy._M_next_resize;
  for (plVar18 = *(long **)&updater.oldToNewTypes[2]._M_h._M_rehash_policy; plVar18 != plVar7;
      plVar18 = plVar18 + 1) {
    if (*(long *)(*plVar18 + 0x30) != 0) {
      Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::walk
                (this_00,(Expression **)(*plVar18 + 0x30));
    }
  }
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
  super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.currFunction =
       (Function *)0x0;
  puVar19 = (this->wasm->tables).
            super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (this->wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar19 != puVar8) {
    do {
      TVar14 = mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::
               HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::
               HeapType_const,wasm::HeapType>>>const&)::CodeUpdater::getNew(wasm::Type_
                         (&local_160,
                          (((puVar19->_M_t).
                            super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                            .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id);
      (((puVar19->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
        super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id = TVar14.id;
      puVar19 = puVar19 + 1;
    } while (puVar19 != puVar8);
  }
  puVar20 = (this->wasm->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (this->wasm->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar20 != puVar9) {
    do {
      TVar14 = mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::
               HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::
               HeapType_const,wasm::HeapType>>>const&)::CodeUpdater::getNew(wasm::Type_
                         (&local_160,
                          (((puVar20->_M_t).
                            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                          type).id);
      (((puVar20->_M_t).
        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t
        .super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->type).id = TVar14.id;
      puVar20 = puVar20 + 1;
    } while (puVar20 != puVar9);
  }
  puVar21 = (this->wasm->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar21 != puVar3) {
    do {
      TVar14 = mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::
               HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::
               HeapType_const,wasm::HeapType>>>const&)::CodeUpdater::getNew(wasm::Type_
                         (&local_160,
                          (((puVar21->_M_t).
                            super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                            .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->type).id);
      (((puVar21->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t
        .super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
        super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->type).id = TVar14.id;
      puVar21 = puVar21 + 1;
    } while (puVar21 != puVar3);
  }
  puVar22 = (this->wasm->tags).
            super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (this->wasm->tags).
            super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar22 != puVar10) {
    do {
      pTVar11 = (puVar22->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                _M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
      TVar14.id = (pTVar11->sig).results.id;
      TVar15 = mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::
               HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::
               HeapType_const,wasm::HeapType>>>const&)::CodeUpdater::getNew(wasm::Type_
                         (&local_160,(pTVar11->sig).params.id);
      TVar14 = mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::
               HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::
               HeapType_const,wasm::HeapType>>>const&)::CodeUpdater::getNew(wasm::Type_
                         (&local_160,TVar14);
      pTVar11 = (puVar22->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                _M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
      (pTVar11->sig).params.id = TVar15.id;
      (pTVar11->sig).results.id = TVar14.id;
      puVar22 = puVar22 + 1;
    } while (puVar22 != puVar10);
  }
  PassRunner::~PassRunner(&local_278);
  if (updater.
      super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
      .super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
      super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.stack.fixed.
      _M_elems[9].currp != (Expression **)0x0) {
    operator_delete(updater.
                    super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
                    .
                    super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>
                    .super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
                    stack.fixed._M_elems[9].currp,
                    (long)updater.
                          super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
                          .
                          super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>
                          .
                          super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::Task,_std::allocator<wasm::Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)updater.
                          super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
                          .
                          super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>
                          .
                          super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>
                          .stack.fixed._M_elems[9].currp);
  }
  local_160 = &PTR__Pass_00d87048;
  if (updater.
      super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
      .super_Pass.runner !=
      (PassRunner *)
      &updater.
       super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
       .super_Pass.name._M_string_length) {
    operator_delete(updater.
                    super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
                    .super_Pass.runner,
                    CONCAT71(updater.
                             super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
                             .super_Pass.name._M_string_length._1_7_,
                             (undefined1)
                             updater.
                             super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
                             .super_Pass.name._M_string_length) + 1);
  }
  return;
}

Assistant:

void GlobalTypeRewriter::mapTypes(const TypeMap& oldToNewTypes) {
  // Replace all the old types in the module with the new ones.
  struct CodeUpdater
    : public WalkerPass<
        PostWalker<CodeUpdater, UnifiedExpressionVisitor<CodeUpdater>>> {
    bool isFunctionParallel() override { return true; }

    const TypeMap& oldToNewTypes;

    CodeUpdater(const TypeMap& oldToNewTypes) : oldToNewTypes(oldToNewTypes) {}

    std::unique_ptr<Pass> create() override {
      return std::make_unique<CodeUpdater>(oldToNewTypes);
    }

    Type getNew(Type type) {
      if (type.isRef()) {
        return Type(getNew(type.getHeapType()), type.getNullability());
      }
      if (type.isTuple()) {
        auto tuple = type.getTuple();
        for (auto& t : tuple.types) {
          t = getNew(t);
        }
        return Type(tuple);
      }
      return type;
    }

    HeapType getNew(HeapType type) {
      if (type.isBasic()) {
        return type;
      }
      auto iter = oldToNewTypes.find(type);
      if (iter != oldToNewTypes.end()) {
        return iter->second;
      }
      return type;
    }

    Signature getNew(Signature sig) {
      return Signature(getNew(sig.params), getNew(sig.results));
    }

    void visitExpression(Expression* curr) {
      // local.get and local.tee are special in that their type is tied to the
      // type of the local in the function, which is tied to the signature. That
      // means we must update it based on the signature, and not on the old type
      // in the local.
      //
      // We have already updated function signatures by the time we get here,
      // which means we can just apply the current local type that we see (there
      // is no need to call getNew(), which we already did on the function's
      // signature itself).
      if (auto* get = curr->dynCast<LocalGet>()) {
        curr->type = getFunction()->getLocalType(get->index);
        return;
      } else if (auto* tee = curr->dynCast<LocalSet>()) {
        // Rule out a local.set and unreachable code.
        if (tee->type != Type::none && tee->type != Type::unreachable) {
          curr->type = getFunction()->getLocalType(tee->index);
        }
        return;
      }

      // Update the type to the new one.
      curr->type = getNew(curr->type);

      // Update any other type fields as well.

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id) [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_TYPE(id, field) cast->field = getNew(cast->field);

#define DELEGATE_FIELD_HEAPTYPE(id, field) cast->field = getNew(cast->field);

#define DELEGATE_FIELD_CHILD(id, field)
#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)
#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
    }
  };

  CodeUpdater updater(oldToNewTypes);
  PassRunner runner(&wasm);

  // Update functions first, so that we see the updated types for locals (which
  // can change if the function signature changes).
  for (auto& func : wasm.functions) {
    func->type = updater.getNew(func->type);
    for (auto& var : func->vars) {
      var = updater.getNew(var);
    }
  }

  updater.run(&runner, &wasm);
  updater.walkModuleCode(&wasm);

  // Update global locations that refer to types.
  for (auto& table : wasm.tables) {
    table->type = updater.getNew(table->type);
  }
  for (auto& elementSegment : wasm.elementSegments) {
    elementSegment->type = updater.getNew(elementSegment->type);
  }
  for (auto& global : wasm.globals) {
    global->type = updater.getNew(global->type);
  }
  for (auto& tag : wasm.tags) {
    tag->sig = updater.getNew(tag->sig);
  }
}